

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_ext_instance_free(lysf_ctx *ctx,lysp_ext_instance *ext)

{
  lyplg_ext_parse_free_clb p_Var1;
  lysp_stmt *plVar2;
  lysp_ext_instance *plVar3;
  lysp_ext_instance *plVar4;
  lysp_stmt *stmt;
  lysp_ext_instance *plVar5;
  long lVar6;
  
  lydict_remove(ctx->ctx,ext->name);
  lydict_remove(ctx->ctx,ext->argument);
  ly_free_prefix_data(ext->format,ext->prefix_data);
  if ((ext->record != (lyplg_ext_record *)0x0) &&
     (p_Var1 = (ext->record->plugin).pfree, p_Var1 != (lyplg_ext_parse_free_clb)0x0)) {
    (*p_Var1)(ctx->ctx,ext);
  }
  stmt = ext->child;
  while (stmt != (lysp_stmt *)0x0) {
    plVar2 = stmt->next;
    lysp_stmt_free(ctx->ctx,stmt);
    stmt = plVar2;
  }
  lVar6 = 0;
  plVar5 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar3 = ext->exts;
    if (plVar3 == (lysp_ext_instance *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = plVar3[-1].exts;
    }
    if (plVar4 <= plVar5) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar6));
    plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
    lVar6 = lVar6 + 0x70;
  }
  if (plVar3 == (lysp_ext_instance *)0x0) {
    return;
  }
  free(&plVar3[-1].exts);
  return;
}

Assistant:

void
lysp_ext_instance_free(struct lysf_ctx *ctx, struct lysp_ext_instance *ext)
{
    struct lysp_stmt *stmt, *next;

    lydict_remove(ctx->ctx, ext->name);
    lydict_remove(ctx->ctx, ext->argument);
    ly_free_prefix_data(ext->format, ext->prefix_data);
    if (ext->record && ext->record->plugin.pfree) {
        ext->record->plugin.pfree(ctx->ctx, ext);
    }

    LY_LIST_FOR_SAFE(ext->child, next, stmt) {
        lysp_stmt_free(ctx->ctx, stmt);
    }

    FREE_ARRAY(ctx, ext->exts, lysp_ext_instance_free);
}